

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorProto::MergePartialFromCodedStream
          (DescriptorProto *this,CodedInputStream *input)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  byte bVar1;
  byte *pbVar2;
  void *pvVar3;
  Rep *pRVar4;
  uint8 *puVar5;
  Arena *this_01;
  char *data;
  bool bVar6;
  short extraout_AX;
  uint32 uVar7;
  Type *this_02;
  Type *this_03;
  Type *this_04;
  Type *this_05;
  MessageOptions *this_06;
  ulong extraout_RAX;
  Type *this_07;
  Type *this_08;
  pair<int,_int> pVar8;
  string *value;
  Type *pTVar9;
  UnknownFieldSet *unknown_fields;
  int iVar10;
  int iVar11;
  RepeatedPtrFieldBase *this_09;
  char cVar12;
  uint tag;
  ulong uVar13;
  int local_94;
  
  this_00 = &this->reserved_name_;
  do {
    pbVar2 = input->buffer_;
    uVar7 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar7 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_002fbe30;
      input->buffer_ = pbVar2 + 1;
      uVar13 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_002fbe30:
      uVar7 = io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar13 = 0;
      if (uVar7 - 1 < 0x7f) {
        uVar13 = 0x100000000;
      }
      uVar13 = uVar7 | uVar13;
    }
    tag = (uint)uVar13;
    if ((uVar13 & 0x100000000) == 0) goto switchD_002fbebb_default;
    cVar12 = (char)uVar13;
    switch((uint)(uVar13 >> 3) & 0x1fffffff) {
    case 1:
      MergePartialFromCodedStream();
      if (extraout_AX == 0) break;
      iVar10 = 6;
      if (extraout_AX == 1) goto LAB_002fbe93;
      goto LAB_002fbe91;
    case 2:
      this_09 = &(this->field_).super_RepeatedPtrFieldBase;
      if (cVar12 != '\x12') break;
LAB_002fbf13:
      this_03 = internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                          (this_09,(Type *)0x0);
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (iVar11 = (int)(char)*puVar5, -1 < (char)*puVar5)) {
        input->buffer_ = puVar5 + 1;
        bVar6 = true;
      }
      else {
        iVar11 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar6 = -1 < iVar11;
      }
      iVar10 = 6;
      if (bVar6) {
        pVar8 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar11);
        if (-1 < (long)pVar8) {
          bVar6 = FieldDescriptorProto::MergePartialFromCodedStream(this_03,input);
          goto LAB_002fc208;
        }
        goto LAB_002fc256;
      }
      goto LAB_002fbe93;
    case 3:
      if (cVar12 == '\x1a') {
        this_07 = internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                            (&(this->nested_type_).super_RepeatedPtrFieldBase,(Type *)0x0);
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (iVar11 = (int)(char)*puVar5, -1 < (char)*puVar5)) {
          input->buffer_ = puVar5 + 1;
          bVar6 = true;
        }
        else {
          iVar11 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          bVar6 = -1 < iVar11;
        }
        iVar10 = 6;
        if (!bVar6) goto LAB_002fbe93;
        pVar8 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar11);
        if ((long)pVar8 < 0) goto LAB_002fc256;
        bVar6 = MergePartialFromCodedStream(this_07,input);
LAB_002fc208:
        iVar10 = 6;
        if (bVar6 == false) goto LAB_002fc256;
        bVar6 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar8.first);
        if (bVar6) goto LAB_002fbe91;
        goto LAB_002fbe93;
      }
      break;
    case 4:
      if (cVar12 == '\"') {
        this_05 = internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                            (&(this->enum_type_).super_RepeatedPtrFieldBase,(Type *)0x0);
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (iVar11 = (int)(char)*puVar5, -1 < (char)*puVar5)) {
          input->buffer_ = puVar5 + 1;
          bVar6 = true;
        }
        else {
          iVar11 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          bVar6 = -1 < iVar11;
        }
        iVar10 = 6;
        if (!bVar6) goto LAB_002fbe93;
        pVar8 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar11);
        if (-1 < (long)pVar8) {
          bVar6 = EnumDescriptorProto::MergePartialFromCodedStream(this_05,input);
          goto LAB_002fc208;
        }
LAB_002fc256:
        iVar10 = 6;
        goto LAB_002fbe93;
      }
      break;
    case 5:
      if (cVar12 == '*') {
        this_04 = internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                            (&(this->extension_range_).super_RepeatedPtrFieldBase,(Type *)0x0);
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (iVar11 = (int)(char)*puVar5, -1 < (char)*puVar5)) {
          input->buffer_ = puVar5 + 1;
          bVar6 = true;
        }
        else {
          iVar11 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          bVar6 = -1 < iVar11;
        }
        iVar10 = 6;
        if (bVar6) {
          pVar8 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar11);
          if (-1 < (long)pVar8) {
            bVar6 = DescriptorProto_ExtensionRange::MergePartialFromCodedStream(this_04,input);
            goto LAB_002fc208;
          }
          goto LAB_002fc256;
        }
        goto LAB_002fbe93;
      }
      break;
    case 6:
      this_09 = &(this->extension_).super_RepeatedPtrFieldBase;
      if (cVar12 == '2') goto LAB_002fbf13;
      break;
    case 7:
      if (cVar12 == ':') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        if (this->options_ == (MessageOptions *)0x0) {
          this_06 = (MessageOptions *)operator_new(0x70);
          MessageOptions::MessageOptions(this_06);
          this->options_ = this_06;
        }
        MergePartialFromCodedStream();
        iVar10 = local_94;
        if ((extraout_RAX & 1) == 0) goto LAB_002fbe91;
        goto LAB_002fbe93;
      }
      break;
    case 8:
      if (cVar12 == 'B') {
        this_02 = internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<google::protobuf::OneofDescriptorProto>::TypeHandler>
                            (&(this->oneof_decl_).super_RepeatedPtrFieldBase,(Type *)0x0);
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (iVar11 = (int)(char)*puVar5, -1 < (char)*puVar5)) {
          input->buffer_ = puVar5 + 1;
          bVar6 = true;
        }
        else {
          iVar11 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          bVar6 = -1 < iVar11;
        }
        iVar10 = 6;
        if (bVar6) {
          pVar8 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar11);
          if (-1 < (long)pVar8) {
            bVar6 = OneofDescriptorProto::MergePartialFromCodedStream(this_02,input);
            goto LAB_002fc208;
          }
          goto LAB_002fc256;
        }
        goto LAB_002fbe93;
      }
      break;
    case 9:
      if (cVar12 == 'J') {
        this_08 = internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::TypeHandler>
                            (&(this->reserved_range_).super_RepeatedPtrFieldBase,(Type *)0x0);
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (iVar11 = (int)(char)*puVar5, -1 < (char)*puVar5)) {
          input->buffer_ = puVar5 + 1;
          bVar6 = true;
        }
        else {
          iVar11 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          bVar6 = -1 < iVar11;
        }
        iVar10 = 6;
        if (bVar6) {
          pVar8 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar11);
          if (-1 < (long)pVar8) {
            bVar6 = DescriptorProto_ReservedRange::MergePartialFromCodedStream(this_08,input);
            goto LAB_002fc208;
          }
          goto LAB_002fc256;
        }
        goto LAB_002fbe93;
      }
      break;
    case 10:
      if (cVar12 != 'R') break;
      pRVar4 = (this->reserved_name_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar4 == (Rep *)0x0) {
LAB_002fc269:
        internal::RepeatedPtrFieldBase::Reserve
                  (&this_00->super_RepeatedPtrFieldBase,
                   (this->reserved_name_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002fc27c:
        pRVar4 = (this->reserved_name_).super_RepeatedPtrFieldBase.rep_;
        pRVar4->allocated_size = pRVar4->allocated_size + 1;
        this_01 = (this->reserved_name_).super_RepeatedPtrFieldBase.arena_;
        if (this_01 == (Arena *)0x0) {
          value = (string *)operator_new(0x20);
          (value->_M_dataplus)._M_p = (pointer)&value->field_2;
          value->_M_string_length = 0;
          (value->field_2)._M_local_buf[0] = '\0';
        }
        else {
          value = (string *)
                  Arena::AllocateAligned(this_01,(type_info *)&std::__cxx11::string::typeinfo,0x20);
          (value->_M_dataplus)._M_p = (pointer)&value->field_2;
          value->_M_string_length = 0;
          (value->field_2)._M_local_buf[0] = '\0';
          Arena::AddListNode(this_01,value,internal::arena_destruct_object<std::__cxx11::string>);
        }
        pRVar4 = (this->reserved_name_).super_RepeatedPtrFieldBase.rep_;
        iVar11 = (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
        (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_ = iVar11 + 1;
        pRVar4->elements[iVar11] = value;
      }
      else {
        iVar11 = (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar4->allocated_size <= iVar11) {
          if (pRVar4->allocated_size ==
              (this->reserved_name_).super_RepeatedPtrFieldBase.total_size_) goto LAB_002fc269;
          goto LAB_002fc27c;
        }
        (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_ = iVar11 + 1;
        value = (string *)pRVar4->elements[iVar11];
      }
      bVar6 = internal::WireFormatLite::ReadBytes(input,value);
      if (bVar6) {
        pTVar9 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (&this_00->super_RepeatedPtrFieldBase,
                            (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_ + -1);
        data = (pTVar9->_M_dataplus)._M_p;
        pTVar9 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (&this_00->super_RepeatedPtrFieldBase,
                            (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_ + -1);
        internal::WireFormatLite::VerifyUtf8String
                  (data,(int)pTVar9->_M_string_length,PARSE,
                   "google.protobuf.DescriptorProto.reserved_name");
        goto LAB_002fbe91;
      }
      goto LAB_002fc3b5;
    }
switchD_002fbebb_default:
    iVar10 = 7;
    if ((tag & 7) != 4 && tag != 0) {
      pvVar3 = (this->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_;
      if (((ulong)pvVar3 & 1) == 0) {
        unknown_fields =
             internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
      }
      else {
        unknown_fields = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
      }
      bVar6 = internal::WireFormat::SkipField(input,tag,unknown_fields);
      if (bVar6) {
LAB_002fbe91:
        iVar10 = 0;
      }
      else {
LAB_002fc3b5:
        iVar10 = 6;
      }
    }
LAB_002fbe93:
    if (iVar10 != 0) {
      return iVar10 != 6;
    }
  } while( true );
}

Assistant:

bool DescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.DescriptorProto)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.DescriptorProto.name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.FieldDescriptorProto field = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_field()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.DescriptorProto nested_type = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_nested_type()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_enum_type()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(42u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_extension_range()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.FieldDescriptorProto extension = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(50u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_extension()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.MessageOptions options = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(58u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.OneofDescriptorProto oneof_decl = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(66u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_oneof_decl()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.DescriptorProto.ReservedRange reserved_range = 9;
      case 9: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(74u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_reserved_range()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated string reserved_name = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_reserved_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->reserved_name(this->reserved_name_size() - 1).data(),
            this->reserved_name(this->reserved_name_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.DescriptorProto.reserved_name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.DescriptorProto)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.DescriptorProto)
  return false;
#undef DO_
}